

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_delete.cpp
# Opt level: O1

void __thiscall duckdb::LogicalDelete::ResolveTypes(LogicalDelete *this)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_28;
  
  if (this->return_chunk == true) {
    TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)&local_48,this->table);
    local_28.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->super_LogicalOperator).types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_28.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->super_LogicalOperator).types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_28.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->super_LogicalOperator).types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->super_LogicalOperator).types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->super_LogicalOperator).types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->super_LogicalOperator).types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_28);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
    return;
  }
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &(this->super_LogicalOperator).types,&LogicalType::BIGINT);
  return;
}

Assistant:

void LogicalDelete::ResolveTypes() {
	if (return_chunk) {
		types = table.GetTypes();
	} else {
		types.emplace_back(LogicalType::BIGINT);
	}
}